

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD5Importer::MD5Importer(MD5Importer *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0075bef8;
  this->mIOHandler = (IOSystem *)0x0;
  (this->mFile)._M_dataplus._M_p = (pointer)&(this->mFile).field_2;
  (this->mFile)._M_string_length = 0;
  (this->mFile).field_2._M_local_buf[0] = '\0';
  this->mBuffer = (char *)0x0;
  this->fileSize = 0;
  this->iLineNumber = 0;
  this->pScene = (aiScene *)0x0;
  this->pIOHandler = (IOSystem *)0x0;
  this->bHadMD5Mesh = false;
  this->bHadMD5Anim = false;
  this->bHadMD5Camera = false;
  this->configNoAutoLoad = false;
  return;
}

Assistant:

MD5Importer::MD5Importer()
    : mIOHandler()
    , mBuffer()
    , fileSize()
    , iLineNumber()
    , pScene()
    , pIOHandler()
    , bHadMD5Mesh()
    , bHadMD5Anim()
    , bHadMD5Camera()
    , configNoAutoLoad (false)
{}